

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  float *pfVar1;
  ImVec2 IVar2;
  undefined8 uVar3;
  ImDrawVert *pIVar4;
  uint *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ImU32 IVar9;
  int iVar10;
  undefined8 *puVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  undefined7 in_register_00000081;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  ImVec2 IVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  undefined4 in_XMM0_Db;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float afStack_a8 [2];
  undefined8 uStack_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 IStack_80;
  int local_74;
  ImVec2 local_70;
  ulong local_68;
  ulong local_60;
  undefined8 local_58;
  float fStack_50;
  float fStack_4c;
  ulong local_48;
  long local_40;
  ImU32 local_34;
  
  if (1 < points_count) {
    local_70 = this->_Data->TexUvWhitePixel;
    local_90 = (ImVec2)(ulong)(points_count - 1U);
    uVar6 = points_count - 1U;
    if (closed) {
      uVar6 = points_count;
    }
    local_58 = CONCAT44(in_XMM0_Db,thickness);
    local_34 = col;
    if ((this->Flags & 1) == 0) {
      uStack_a0 = 0x166dad;
      PrimReserve(this,uVar6 * 6,uVar6 * 4);
      if (0 < (int)uVar6) {
        fVar23 = (float)local_58 * 0.5;
        uVar16 = 1;
        fVar22 = fVar23;
        IVar9 = local_34;
        local_98 = (ImVec2)points;
        fStack_50 = fVar23;
        fStack_4c = fVar23;
        local_58._0_4_ = fVar23;
        local_58._4_4_ = fVar23;
        do {
          uVar8 = uVar16;
          if ((uint)points_count == uVar16) {
            uVar8 = 0;
          }
          IVar19 = *(ImVec2 *)((long)points + uVar8 * 8);
          IVar2 = *(ImVec2 *)((long)points + (uVar16 - 1) * 8);
          local_88.x = IVar19.x - IVar2.x;
          local_88.y = IVar19.y - IVar2.y;
          fVar21 = local_88.x * local_88.x + local_88.y * local_88.y;
          if (0.0 < fVar21) {
            if (fVar21 < 0.0) {
              IStack_80.x = 0.0;
              IStack_80.y = 0.0;
              uStack_a0 = 0x166e3a;
              fVar21 = sqrtf(fVar21);
              points = (ImVec2 *)local_98;
              fVar23 = (float)local_58;
              fVar22 = local_58._4_4_;
              IVar9 = local_34;
            }
            else {
              fVar21 = SQRT(fVar21);
            }
            local_88.x = local_88.x * (1.0 / fVar21);
            local_88.y = local_88.y * (1.0 / fVar21);
          }
          local_88.x = local_88.x * fVar23;
          local_88.y = local_88.y * fVar22;
          pIVar4 = this->_VtxWritePtr;
          IVar19 = *(ImVec2 *)((long)points + (uVar16 - 1) * 8);
          IVar2.y = IVar19.y - local_88.x;
          IVar2.x = IVar19.x + local_88.y;
          pIVar4->pos = IVar2;
          pIVar4->uv = local_70;
          pIVar4 = this->_VtxWritePtr;
          pIVar4->col = IVar9;
          pIVar4[1].pos.x = ((ImVec2 *)((long)points + uVar8 * 8))->x + local_88.y;
          pIVar4[1].pos.y = ((ImVec2 *)((long)points + uVar8 * 8))->y - local_88.x;
          pIVar4[1].uv = local_70;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[1].col = IVar9;
          pIVar4[2].pos.x = ((ImVec2 *)((long)points + uVar8 * 8))->x - local_88.y;
          pIVar4[2].pos.y = ((ImVec2 *)((long)points + uVar8 * 8))->y + local_88.x;
          pIVar4[2].uv = local_70;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[2].col = IVar9;
          pIVar4[3].pos.x = ((ImVec2 *)((long)points + (uVar16 - 1) * 8))->x - local_88.y;
          pIVar4[3].pos.y = ((ImVec2 *)((long)points + (uVar16 - 1) * 8))->y + local_88.x;
          pIVar4[3].uv = local_70;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[3].col = IVar9;
          this->_VtxWritePtr = pIVar4 + 4;
          puVar5 = this->_IdxWritePtr;
          *puVar5 = this->_VtxCurrentIdx;
          puVar5[1] = this->_VtxCurrentIdx + 1;
          puVar5[2] = this->_VtxCurrentIdx + 2;
          puVar5[3] = this->_VtxCurrentIdx;
          puVar5[4] = this->_VtxCurrentIdx + 2;
          puVar5[5] = this->_VtxCurrentIdx + 3;
          this->_IdxWritePtr = puVar5 + 6;
          this->_VtxCurrentIdx = this->_VtxCurrentIdx + 4;
          bVar20 = uVar16 != uVar6;
          uVar16 = uVar16 + 1;
        } while (bVar20);
      }
    }
    else {
      local_40 = CONCAT44(local_40._4_4_,(int)CONCAT71(in_register_00000081,closed));
      iVar12 = 0xc;
      if (1.0 < thickness) {
        iVar12 = 0x12;
      }
      local_74 = points_count * 3;
      if (1.0 < thickness) {
        local_74 = points_count * 4;
      }
      uStack_a0 = 0x166fd0;
      PrimReserve(this,iVar12 * uVar6,local_74);
      lVar13 = -((ulong)(((uint)(1.0 < thickness) * 2 + 3) * points_count) * 8 + 0xf &
                0xfffffffffffffff0);
      puVar11 = (undefined8 *)((long)&local_98 + lVar13);
      local_48 = (ulong)(uint)points_count;
      uVar16 = (ulong)(uint)points_count;
      local_60 = (ulong)uVar6;
      local_68 = uVar16;
      IVar9 = local_34;
      if (0 < (int)uVar6) {
        uVar8 = 1;
        do {
          uVar7 = uVar8;
          if (uVar16 == uVar8) {
            uVar7 = 0;
          }
          local_88.x = points[uVar7].x - points[uVar8 - 1].x;
          local_88.y = points[uVar7].y - points[uVar8 - 1].y;
          fVar23 = local_88.x * local_88.x + local_88.y * local_88.y;
          if (0.0 < fVar23) {
            if (fVar23 < 0.0) {
              IStack_80.x = 0.0;
              IStack_80.y = 0.0;
              *(undefined8 *)((long)&uStack_a0 + lVar13) = 0x167072;
              fVar23 = sqrtf(fVar23);
              uVar16 = local_68;
              IVar9 = local_34;
            }
            else {
              fVar23 = SQRT(fVar23);
            }
            local_88.x = local_88.x * (1.0 / fVar23);
            local_88.y = local_88.y * (1.0 / fVar23);
          }
          *(float *)((long)&uStack_a0 + uVar8 * 8 + lVar13) = local_88.y;
          *(float *)((long)&uStack_a0 + uVar8 * 8 + lVar13 + 4) = -local_88.x;
          bVar20 = uVar8 != uVar6;
          uVar8 = uVar8 + 1;
        } while (bVar20);
      }
      IVar19 = (ImVec2)(puVar11 + uVar16);
      if ((char)local_40 == '\0') {
        *(undefined8 *)((long)IVar19 + -8) = *(undefined8 *)((long)IVar19 + -0x10);
      }
      uVar6 = IVar9 & 0xffffff;
      local_88 = IVar19;
      uVar14 = (uint)local_48;
      if ((float)local_58 <= 1.0) {
        if ((char)local_40 == '\0') {
          fVar23 = (float)*puVar11;
          fVar22 = (float)((ulong)*puVar11 >> 0x20);
          fVar21 = (*points).x;
          fVar24 = (*points).y;
          *(float *)IVar19 = fVar23 + fVar21;
          *(float *)((long)IVar19 + 4) = fVar22 + fVar24;
          *(float *)((long)IVar19 + 8) = fVar21 - fVar23;
          *(float *)((long)IVar19 + 0xc) = fVar24 - fVar22;
          uVar7 = (ulong)local_90 & 0xffffffff;
          fVar23 = points[uVar7].x;
          fVar22 = points[uVar7].y;
          uVar8 = (ulong)(uint)((int)local_90.x * 2);
          *(ulong *)((long)IVar19 + uVar8 * 2 * 4) =
               CONCAT44((float)((ulong)puVar11[uVar7] >> 0x20) + fVar22,
                        (float)puVar11[uVar7] + fVar23);
          *(ulong *)((long)IVar19 + (uVar8 * 2 + 2) * 4) =
               CONCAT44(fVar22 - (float)((ulong)puVar11[uVar7] >> 0x20),
                        fVar23 - (float)puVar11[uVar7]);
        }
        if (0 < (int)local_60) {
          puVar5 = this->_IdxWritePtr;
          local_58 = (local_60 & 0xffffffff) * 0x30;
          uVar8 = 1;
          lVar18 = 0;
          uVar14 = this->_VtxCurrentIdx;
          do {
            bVar20 = uVar16 * 0x30 + -0x30 == lVar18;
            uVar7 = uVar8 & 0xffffffff;
            if (bVar20) {
              uVar7 = 0;
            }
            uVar17 = uVar14 + 3;
            if (bVar20) {
              uVar17 = this->_VtxCurrentIdx;
            }
            uVar3 = *(undefined8 *)((long)&uStack_a0 + uVar8 * 8 + lVar13);
            fVar22 = ((float)puVar11[uVar7] + (float)uVar3) * 0.5;
            fVar21 = ((float)((ulong)puVar11[uVar7] >> 0x20) + (float)((ulong)uVar3 >> 0x20)) * 0.5;
            fVar24 = fVar22 * fVar22 + fVar21 * fVar21;
            fVar23 = 0.5;
            if (0.5 <= fVar24) {
              fVar23 = fVar24;
            }
            fVar22 = (1.0 / fVar23) * fVar22;
            fVar21 = (1.0 / fVar23) * fVar21;
            fVar23 = points[uVar7].x;
            fVar24 = points[uVar7].y;
            pfVar1 = (float *)((long)IVar19 + (ulong)(uint)((int)uVar7 * 2) * 2 * 4);
            *pfVar1 = fVar22 + fVar23;
            pfVar1[1] = fVar21 + fVar24;
            pfVar1[2] = fVar23 - fVar22;
            pfVar1[3] = fVar24 - fVar21;
            *(uint *)((long)puVar5 + lVar18) = uVar17;
            *(uint *)((long)puVar5 + lVar18 + 4) = uVar14;
            *(uint *)((long)puVar5 + lVar18 + 8) = uVar14 + 2;
            *(uint *)((long)puVar5 + lVar18 + 0xc) = uVar14 + 2;
            *(uint *)((long)puVar5 + lVar18 + 0x10) = uVar17 + 2;
            *(uint *)((long)puVar5 + lVar18 + 0x14) = uVar17;
            *(uint *)((long)puVar5 + lVar18 + 0x18) = uVar17 + 1;
            *(uint *)((long)puVar5 + lVar18 + 0x1c) = uVar14 + 1;
            *(uint *)((long)puVar5 + lVar18 + 0x20) = uVar14;
            *(uint *)((long)puVar5 + lVar18 + 0x24) = uVar14;
            *(uint *)((long)puVar5 + lVar18 + 0x28) = uVar17;
            *(uint *)((long)puVar5 + lVar18 + 0x2c) = uVar17 + 1;
            uVar8 = uVar8 + 1;
            lVar18 = lVar18 + 0x30;
            IVar19 = local_88;
            uVar14 = uVar17;
          } while (local_58 != lVar18);
          this->_IdxWritePtr = (uint *)((long)puVar5 + lVar18);
          uVar14 = (uint)local_48;
          uVar16 = local_68;
          IVar9 = local_34;
        }
        uVar8 = 1;
        if (1 < (int)uVar14) {
          uVar8 = (ulong)uVar14;
        }
        lVar13 = 0;
        do {
          this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar13);
          this->_VtxWritePtr->uv = local_70;
          pIVar4 = this->_VtxWritePtr;
          pIVar4->col = IVar9;
          pIVar4[1].pos = *(ImVec2 *)((long)puVar11 + lVar13 * 2 + uVar16 * 8);
          this->_VtxWritePtr[1].uv = local_70;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[1].col = uVar6;
          pIVar4[2].pos = *(ImVec2 *)((long)puVar11 + lVar13 * 2 + uVar16 * 8 + 8);
          this->_VtxWritePtr[2].uv = local_70;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[2].col = uVar6;
          this->_VtxWritePtr = pIVar4 + 3;
          lVar13 = lVar13 + 8;
        } while (uVar8 * 8 != lVar13);
      }
      else {
        fVar23 = ((float)local_58 + -1.0) * 0.5;
        if ((char)local_40 == '\0') {
          fVar22 = fVar23 + 1.0;
          fVar21 = (float)*puVar11;
          fVar24 = (float)((ulong)*puVar11 >> 0x20);
          fVar25 = fVar22 * fVar21;
          fVar26 = fVar22 * fVar24;
          fVar27 = (*points).x;
          fVar28 = (*points).y;
          fVar21 = fVar21 * fVar23;
          fVar24 = fVar24 * fVar23;
          *(float *)IVar19 = fVar25 + fVar27;
          *(float *)((long)IVar19 + 4) = fVar26 + fVar28;
          *(float *)((long)IVar19 + 8) = fVar21 + fVar27;
          *(float *)((long)IVar19 + 0xc) = fVar24 + fVar28;
          *(float *)((long)IVar19 + 0x10) = fVar27 - fVar21;
          *(float *)((long)IVar19 + 0x14) = fVar28 - fVar24;
          *(float *)((long)IVar19 + 0x18) = fVar27 - fVar25;
          *(float *)((long)IVar19 + 0x1c) = fVar28 - fVar26;
          uVar7 = (ulong)local_90 & 0xffffffff;
          fVar21 = points[uVar7].x;
          fVar24 = points[uVar7].y;
          uVar8 = (ulong)(uint)((int)local_90.x << 2);
          *(ulong *)((long)IVar19 + uVar8 * 2 * 4) =
               CONCAT44((float)((ulong)puVar11[uVar7] >> 0x20) * fVar22 + fVar24,
                        (float)puVar11[uVar7] * fVar22 + fVar21);
          *(ulong *)((long)IVar19 + (uVar8 * 2 + 2) * 4) =
               CONCAT44((float)((ulong)puVar11[uVar7] >> 0x20) * fVar23 + fVar24,
                        (float)puVar11[uVar7] * fVar23 + fVar21);
          *(ulong *)((long)IVar19 + (uVar8 * 2 + 4) * 4) =
               CONCAT44(fVar24 - (float)((ulong)puVar11[uVar7] >> 0x20) * fVar23,
                        fVar21 - (float)puVar11[uVar7] * fVar23);
          *(ulong *)((long)IVar19 + (uVar8 * 2 + 6) * 4) =
               CONCAT44(fVar24 - (float)((ulong)puVar11[uVar7] >> 0x20) * fVar22,
                        fVar21 - (float)puVar11[uVar7] * fVar22);
        }
        if (0 < (int)local_60) {
          puVar5 = this->_IdxWritePtr;
          local_58 = (local_60 & 0xffffffff) * 0x48;
          local_40 = uVar16 * 0x48 + -0x48;
          uVar16 = 1;
          lVar18 = 0;
          uVar14 = this->_VtxCurrentIdx;
          do {
            uVar8 = uVar16 & 0xffffffff;
            if (local_40 == lVar18) {
              uVar8 = 0;
            }
            uVar17 = uVar14 + 4;
            if (local_40 == lVar18) {
              uVar17 = this->_VtxCurrentIdx;
            }
            uVar3 = *(undefined8 *)((long)&uStack_a0 + uVar16 * 8 + lVar13);
            fVar21 = ((float)puVar11[uVar8] + (float)uVar3) * 0.5;
            fVar24 = ((float)((ulong)puVar11[uVar8] >> 0x20) + (float)((ulong)uVar3 >> 0x20)) * 0.5;
            fVar25 = fVar21 * fVar21 + fVar24 * fVar24;
            fVar22 = 0.5;
            if (0.5 <= fVar25) {
              fVar22 = fVar25;
            }
            fVar22 = 1.0 / fVar22;
            fVar27 = points[uVar8].x;
            fVar28 = points[uVar8].y;
            uVar8 = (ulong)(uint)((int)uVar8 << 2);
            fVar25 = fVar21 * fVar22 * (fVar23 + 1.0);
            fVar26 = fVar24 * fVar22 * (fVar23 + 1.0);
            fVar21 = fVar21 * fVar22 * fVar23;
            fVar22 = fVar24 * fVar22 * fVar23;
            pfVar1 = (float *)((long)IVar19 + uVar8 * 2 * 4);
            *pfVar1 = fVar27 + fVar25;
            pfVar1[1] = fVar28 + fVar26;
            pfVar1[2] = fVar27 + fVar21;
            pfVar1[3] = fVar28 + fVar22;
            pfVar1 = (float *)((long)IVar19 + (uVar8 * 2 + 4) * 4);
            *pfVar1 = fVar27 - fVar21;
            pfVar1[1] = fVar28 - fVar22;
            pfVar1[2] = fVar27 - fVar25;
            pfVar1[3] = fVar28 - fVar26;
            iVar10 = uVar17 + 1;
            *(int *)((long)puVar5 + lVar18) = iVar10;
            *(uint *)((long)puVar5 + lVar18 + 4) = uVar14 + 1;
            iVar12 = uVar14 + 2;
            *(int *)((long)puVar5 + lVar18 + 8) = iVar12;
            *(int *)((long)puVar5 + lVar18 + 0xc) = iVar12;
            iVar15 = uVar17 + 2;
            *(int *)((long)puVar5 + lVar18 + 0x10) = iVar15;
            *(int *)((long)puVar5 + lVar18 + 0x14) = iVar10;
            *(int *)((long)puVar5 + lVar18 + 0x18) = iVar10;
            *(uint *)((long)puVar5 + lVar18 + 0x1c) = uVar14 + 1;
            *(uint *)((long)puVar5 + lVar18 + 0x20) = uVar14;
            *(uint *)((long)puVar5 + lVar18 + 0x24) = uVar14;
            *(uint *)((long)puVar5 + lVar18 + 0x28) = uVar17;
            *(int *)((long)puVar5 + lVar18 + 0x2c) = iVar10;
            *(int *)((long)puVar5 + lVar18 + 0x30) = iVar15;
            *(int *)((long)puVar5 + lVar18 + 0x34) = iVar12;
            *(uint *)((long)puVar5 + lVar18 + 0x38) = uVar14 + 3;
            *(uint *)((long)puVar5 + lVar18 + 0x3c) = uVar14 + 3;
            *(uint *)((long)puVar5 + lVar18 + 0x40) = uVar17 + 3;
            *(int *)((long)puVar5 + lVar18 + 0x44) = iVar15;
            uVar16 = uVar16 + 1;
            lVar18 = lVar18 + 0x48;
            IVar19 = local_88;
            uVar14 = uVar17;
          } while (local_58 != lVar18);
          this->_IdxWritePtr = (uint *)((long)puVar5 + lVar18);
          uVar14 = (uint)local_48;
          uVar16 = local_68;
          IVar9 = local_34;
        }
        uVar8 = 1;
        if (1 < (int)uVar14) {
          uVar8 = (ulong)uVar14;
        }
        lVar13 = 0;
        do {
          this->_VtxWritePtr->pos = *(ImVec2 *)((long)puVar11 + lVar13 + uVar16 * 8);
          this->_VtxWritePtr->uv = local_70;
          pIVar4 = this->_VtxWritePtr;
          pIVar4->col = uVar6;
          pIVar4[1].pos = *(ImVec2 *)((long)puVar11 + lVar13 + uVar16 * 8 + 8);
          this->_VtxWritePtr[1].uv = local_70;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[1].col = IVar9;
          pIVar4[2].pos = *(ImVec2 *)((long)puVar11 + lVar13 + uVar16 * 8 + 0x10);
          this->_VtxWritePtr[2].uv = local_70;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[2].col = IVar9;
          pIVar4[3].pos = *(ImVec2 *)((long)puVar11 + lVar13 + uVar16 * 8 + 0x18);
          this->_VtxWritePtr[3].uv = local_70;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[3].col = uVar6;
          this->_VtxWritePtr = pIVar4 + 4;
          lVar13 = lVar13 + 0x20;
        } while (uVar8 * 0x20 != lVar13);
      }
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + local_74;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    int count = points_count;
    if (!closed)
        count = points_count-1;

    const bool thick_line = (thickness > 1.0f);
    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        const int idx_count = thick_line ? count*18 : count*12;
        const int vtx_count = thick_line ? points_count*4 : points_count*3;
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * (thick_line ? 5 : 3) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count-1] = temp_normals[points_count-2];

        if (!thick_line)
        {
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * AA_SIZE;
                temp_points[1] = points[0] - temp_normals[0] * AA_SIZE;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * AA_SIZE;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * AA_SIZE;
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+3;

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= AA_SIZE;
                dm_y *= AA_SIZE;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2*2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                // Add indexes
                _IdxWritePtr[0] = (ImDrawIdx)(idx2+0); _IdxWritePtr[1] = (ImDrawIdx)(idx1+0); _IdxWritePtr[2] = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3] = (ImDrawIdx)(idx1+2); _IdxWritePtr[4] = (ImDrawIdx)(idx2+2); _IdxWritePtr[5] = (ImDrawIdx)(idx2+0);
                _IdxWritePtr[6] = (ImDrawIdx)(idx2+1); _IdxWritePtr[7] = (ImDrawIdx)(idx1+1); _IdxWritePtr[8] = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9] = (ImDrawIdx)(idx1+0); _IdxWritePtr[10]= (ImDrawIdx)(idx2+0); _IdxWritePtr[11]= (ImDrawIdx)(idx2+1);
                _IdxWritePtr += 12;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = points[i];          _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
                _VtxWritePtr[1].pos = temp_points[i*2+0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans;
                _VtxWritePtr[2].pos = temp_points[i*2+1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr += 3;
            }
        }
        else
        {
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2*4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Stroke
        const int idx_count = count*6;
        const int vtx_count = count*4;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}